

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::visitFunctionStart
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Function *func)

{
  bool bVar1;
  Ok local_85;
  uint local_84;
  Err local_80;
  Err *local_50;
  Err *err;
  Result<wasm::Ok> _val;
  Function *func_local;
  ParseDefsCtx *this_local;
  
  this->func = func;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = func;
  IRBuilder::visitFunctionStart((Result<wasm::Ok> *)&err,&this->irBuilder,func);
  local_50 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_50 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_80,local_50);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_80);
    wasm::Err::~Err(&local_80);
  }
  local_84 = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_84 == 0) {
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_85);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> visitFunctionStart(Function* func) {
    this->func = func;
    CHECK_ERR(irBuilder.visitFunctionStart(func));
    return Ok{};
  }